

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O2

String * __thiscall
indigox::Element::ToString_abi_cxx11_(String *__return_storage_ptr__,Element *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,(string *)this);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::operator<<(poVar1,(string *)&this->symbol_);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

String Element::ToString() const {
    std::stringstream ss;
    ss << name_ << " (" << symbol_ << ")";
    return ss.str();
  }